

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrsv.c
# Opt level: O1

void ctrsv_(char *uplo,char *trans,char *diag,integer *n,singlecomplex *a,integer *lda,
           singlecomplex *x,integer *incx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  singlecomplex *psVar14;
  int iVar15;
  float *pfVar16;
  int iVar17;
  long lVar18;
  float *pfVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  integer info;
  singlecomplex q__3;
  singlecomplex local_a8;
  singlecomplex local_a0;
  singlecomplex local_98;
  float *local_90;
  int local_84;
  singlecomplex *local_80;
  int *local_78;
  singlecomplex local_70;
  uint *local_68;
  float *local_60;
  long local_58;
  long local_50;
  float *local_48;
  long local_40;
  float *local_38;
  
  local_84 = 0;
  cVar5 = *uplo;
  if ((cVar5 == 'L') || (cVar5 == 'U')) {
    if (((byte)*trans - 0x43 < 0x12) && ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) != 0)) {
      if ((*diag == 'N') || (*diag == 'U')) {
        iVar15 = *n;
        if (iVar15 < 0) {
          local_84 = 4;
        }
        else {
          iVar20 = 1;
          if (1 < iVar15) {
            iVar20 = iVar15;
          }
          if (*lda < iVar20) {
            local_84 = 6;
          }
          else if (*incx == 0) {
            local_84 = 8;
          }
        }
      }
      else {
        local_84 = 3;
      }
    }
    else {
      local_84 = 2;
    }
  }
  else {
    local_84 = 1;
  }
  if (local_84 == 0) {
    uVar7 = *n;
    uVar10 = (ulong)uVar7;
    if (uVar10 != 0) {
      cVar6 = *diag;
      iVar15 = *incx;
      iVar20 = uVar7 - 1;
      iVar17 = 1 - iVar15 * iVar20;
      if (0 < iVar15) {
        iVar17 = 1;
      }
      local_90 = (float *)CONCAT44(local_90._4_4_,iVar17);
      local_58 = CONCAT71(local_58._1_7_,*trans);
      local_80 = a;
      local_78 = lda;
      local_68 = (uint *)n;
      if (*trans == 'N') {
        if (cVar5 == 'U') {
          if (iVar15 == 1) {
            if (0 < (int)uVar7) {
              lVar23 = uVar10 * 8;
              do {
                lVar23 = lVar23 + -8;
                psVar14 = x + (uVar10 - 1);
                if ((((psVar14->r != 0.0) || (NAN(psVar14->r))) || (x[uVar10 - 1].i != 0.0)) ||
                   (NAN(x[uVar10 - 1].i))) {
                  if (cVar6 == 'N') {
                    c_div(&local_a0,psVar14,a + (int)(uVar10 - 1) * (*lda + 1));
                    psVar14->r = local_a0.r;
                    x[uVar10 - 1].i = local_a0.i;
                    a = local_80;
                    lda = local_78;
                  }
                  fVar1 = psVar14->r;
                  fVar2 = x[uVar10 - 1].i;
                  local_a8 = *psVar14;
                  if (1 < (long)uVar10) {
                    iVar15 = *lda;
                    uVar12 = uVar10;
                    do {
                      fVar3 = *(float *)((long)&a[uVar12 - 2].r + iVar15 * lVar23);
                      fVar4 = *(float *)((long)a + uVar12 * 8 + iVar15 * lVar23 + -0xc);
                      local_98.r = fVar1 * fVar3 + fVar4 * -fVar2;
                      local_98.i = fVar4 * fVar1 + fVar3 * fVar2;
                      local_a0.r = x[uVar12 - 2].r - local_98.r;
                      local_a0.i = x[uVar12 - 2].i - local_98.i;
                      x[uVar12 - 2].r = local_a0.r;
                      x[uVar12 - 2].i = local_a0.i;
                      uVar12 = uVar12 - 1;
                    } while (1 < (long)uVar12);
                  }
                }
                bVar9 = 1 < (long)uVar10;
                uVar10 = uVar10 - 1;
              } while (bVar9);
            }
          }
          else if (0 < (int)uVar7) {
            local_90 = (float *)CONCAT44(local_90._4_4_,iVar17 + iVar15 * (uVar7 - 1));
            do {
              lVar23 = (long)(int)local_90;
              iVar15 = (int)uVar10;
              if (((x[lVar23 + -1].r != 0.0) || (NAN(x[lVar23 + -1].r))) ||
                 ((x[lVar23 + -1].i != 0.0 || (NAN(x[lVar23 + -1].i))))) {
                if (cVar6 == 'N') {
                  c_div(&local_a0,x + lVar23 + -1,a + (*lda + 1) * (iVar15 + -1));
                  x[lVar23 + -1].r = local_a0.r;
                  x[lVar23 + -1].i = local_a0.i;
                  a = local_80;
                  lda = local_78;
                }
                fVar1 = x[lVar23 + -1].r;
                fVar2 = x[lVar23 + -1].i;
                local_a8 = x[lVar23 + -1];
                if (1 < iVar15) {
                  iVar17 = *incx;
                  iVar8 = *lda;
                  iVar11 = (int)local_90 - iVar17;
                  uVar12 = uVar10;
                  do {
                    local_98.r = fVar1 * a[(long)iVar20 * (long)iVar8 + (uVar12 - 2)].r +
                                 a[(long)iVar20 * (long)iVar8 + (uVar12 - 2)].i * -fVar2;
                    local_98.i = a[(long)iVar20 * (long)iVar8 + (uVar12 - 2)].i * fVar1 +
                                 a[(long)iVar20 * (long)iVar8 + (uVar12 - 2)].r * fVar2;
                    local_a0.r = x[(long)iVar11 + -1].r - local_98.r;
                    local_a0.i = x[(long)iVar11 + -1].i - local_98.i;
                    x[(long)iVar11 + -1].r = local_a0.r;
                    x[(long)iVar11 + -1].i = local_a0.i;
                    uVar12 = uVar12 - 1;
                    iVar11 = iVar11 - iVar17;
                  } while (1 < (long)uVar12);
                }
              }
              local_90 = (float *)CONCAT44(local_90._4_4_,(int)local_90 - *incx);
              uVar10 = uVar10 - 1;
              iVar20 = iVar20 + -1;
            } while (1 < iVar15);
          }
        }
        else if (iVar15 == 1) {
          if (0 < *n) {
            local_90 = &a[1].i;
            pfVar16 = &x[1].i;
            lVar21 = -1;
            lVar18 = 0;
            lVar23 = 1;
            do {
              psVar14 = x + lVar23 + -1;
              if (((psVar14->r != 0.0) || (NAN(psVar14->r))) ||
                 ((x[lVar23 + -1].i != 0.0 || (NAN(x[lVar23 + -1].i))))) {
                if (cVar6 == 'N') {
                  c_div(&local_a0,psVar14,a + ((int)lVar23 + -1) * (*lda + 1));
                  psVar14->r = local_a0.r;
                  x[lVar23 + -1].i = local_a0.i;
                  a = local_80;
                  lda = local_78;
                  n = (integer *)local_68;
                }
                fVar1 = psVar14->r;
                fVar2 = x[lVar23 + -1].i;
                local_a8 = *psVar14;
                uVar7 = *n;
                if (lVar23 < (int)uVar7) {
                  iVar15 = *lda;
                  lVar13 = 0;
                  do {
                    fVar3 = *(float *)((long)local_90 + lVar13 * 8 + iVar15 * lVar18 + -4);
                    fVar4 = *(float *)((long)local_90 + lVar13 * 8 + iVar15 * lVar18);
                    local_98.r = fVar1 * fVar3 + fVar4 * -fVar2;
                    local_98.i = fVar4 * fVar1 + fVar3 * fVar2;
                    local_a0.r = pfVar16[lVar13 * 2 + -1] - local_98.r;
                    local_a0.i = pfVar16[lVar13 * 2] - local_98.i;
                    pfVar16[lVar13 * 2 + -1] = local_a0.r;
                    pfVar16[lVar13 * 2] = local_a0.i;
                    lVar13 = lVar13 + 1;
                  } while ((ulong)uVar7 + lVar21 != lVar13);
                }
              }
              lVar21 = lVar21 + -1;
              local_90 = local_90 + 2;
              lVar18 = lVar18 + 8;
              pfVar16 = pfVar16 + 2;
              bVar9 = lVar23 < *n;
              lVar23 = lVar23 + 1;
            } while (bVar9);
          }
        }
        else if (0 < *n) {
          local_60 = &x[-1].i;
          local_58 = 0;
          iVar20 = 0;
          psVar14 = a;
          iVar15 = 1;
          do {
            lVar23 = (long)(int)local_90;
            if ((((x[lVar23 + -1].r != 0.0) || (NAN(x[lVar23 + -1].r))) || (x[lVar23 + -1].i != 0.0)
                ) || (NAN(x[lVar23 + -1].i))) {
              if (cVar6 == 'N') {
                c_div(&local_a0,x + lVar23 + -1,psVar14 + (*lda + 1) * (iVar15 + -1));
                x[lVar23 + -1].r = local_a0.r;
                x[lVar23 + -1].i = local_a0.i;
                psVar14 = local_80;
                lda = local_78;
                n = (integer *)local_68;
              }
              fVar1 = x[lVar23 + -1].r;
              fVar2 = x[lVar23 + -1].i;
              local_a8 = x[lVar23 + -1];
              uVar7 = *n;
              if (iVar15 < (int)uVar7) {
                iVar17 = *incx;
                iVar8 = *lda;
                pfVar16 = local_60 + (lVar23 + iVar17) * 2;
                lVar23 = 1;
                do {
                  local_98.r = fVar1 * a[(long)iVar20 * (long)iVar8 + lVar23].r +
                               a[(long)iVar20 * (long)iVar8 + lVar23].i * -fVar2;
                  local_98.i = a[(long)iVar20 * (long)iVar8 + lVar23].i * fVar1 +
                               a[(long)iVar20 * (long)iVar8 + lVar23].r * fVar2;
                  local_a0.r = ((singlecomplex *)(pfVar16 + -1))->r - local_98.r;
                  local_a0.i = *pfVar16 - local_98.i;
                  ((singlecomplex *)(pfVar16 + -1))->r = local_a0.r;
                  *pfVar16 = local_a0.i;
                  pfVar16 = pfVar16 + (long)iVar17 * 2;
                  lVar23 = lVar23 + 1;
                } while ((ulong)uVar7 + local_58 != lVar23);
              }
            }
            local_90 = (float *)CONCAT44(local_90._4_4_,(int)local_90 + *incx);
            a = a + 1;
            iVar20 = iVar20 + 1;
            local_58 = local_58 + -1;
            bVar9 = iVar15 < *n;
            iVar15 = iVar15 + 1;
          } while (bVar9);
        }
      }
      else if (cVar5 == 'U') {
        if (iVar15 == 1) {
          if (0 < *n) {
            local_90 = &a->i;
            lVar23 = 0;
            uVar10 = 1;
            do {
              iVar15 = (int)uVar10 + -1;
              local_a8.r = x[uVar10 - 1].r;
              local_a8.i = x[uVar10 - 1].i;
              if ((char)local_58 == 'T') {
                if (1 < uVar10) {
                  lVar18 = 0;
                  do {
                    fVar1 = *(float *)((long)local_90 + lVar18 + *lda * lVar23 + -4);
                    fVar2 = *(float *)((long)local_90 + lVar18 + *lda * lVar23);
                    fVar3 = *(float *)((long)&x->r + lVar18);
                    fVar4 = *(float *)((long)&x->i + lVar18);
                    local_98.r = fVar1 * fVar3 - fVar4 * fVar2;
                    local_98.i = fVar1 * fVar4 + fVar3 * fVar2;
                    local_a8.r = local_a8.r - local_98.r;
                    local_a8.i = local_a8.i - local_98.i;
                    lVar18 = lVar18 + 8;
                    local_a0.r = local_a8.r;
                    local_a0.i = local_a8.i;
                  } while (lVar23 != lVar18);
                }
                if (cVar6 == 'N') {
                  psVar14 = a + iVar15 * (*lda + 1);
LAB_0011b169:
                  c_div(&local_a0,&local_a8,psVar14);
                  local_a8.r = local_a0.r;
                  local_a8.i = local_a0.i;
                  a = local_80;
                  lda = local_78;
                  n = (integer *)local_68;
                }
              }
              else {
                if (1 < uVar10) {
                  lVar18 = 0;
                  do {
                    r_cnjg(&local_70,(singlecomplex *)((long)&a->r + lVar18 + *lda * lVar23));
                    fVar1 = *(float *)((long)&x->r + lVar18);
                    fVar2 = *(float *)((long)&x->i + lVar18);
                    local_98.r = local_70.r * fVar1 - fVar2 * local_70.i;
                    local_98.i = local_70.r * fVar2 + fVar1 * local_70.i;
                    local_a0.r = local_a8.r - local_98.r;
                    local_a0.i = local_a8.i - local_98.i;
                    lVar18 = lVar18 + 8;
                    a = local_80;
                    lda = local_78;
                    local_a8.r = local_a0.r;
                    local_a8.i = local_a0.i;
                  } while (lVar23 != lVar18);
                }
                n = (integer *)local_68;
                if (cVar6 == 'N') {
                  psVar14 = &local_98;
                  r_cnjg(psVar14,a + iVar15 * (*lda + 1));
                  goto LAB_0011b169;
                }
              }
              x[uVar10 - 1].r = local_a8.r;
              x[uVar10 - 1].i = local_a8.i;
              lVar23 = lVar23 + 8;
              bVar9 = (long)uVar10 < (long)*n;
              uVar10 = uVar10 + 1;
            } while (bVar9);
          }
        }
        else if (0 < *n) {
          local_48 = &x[(long)iVar17 + -1].i;
          local_38 = &a->i;
          pfVar16 = (float *)0x0;
          lVar23 = 0;
          uVar10 = 1;
          do {
            lVar18 = uVar10 - 1;
            lVar21 = (long)iVar17;
            local_a8.r = x[lVar21 + -1].r;
            local_a8.i = x[lVar21 + -1].i;
            if ((char)local_58 == 'T') {
              if (1 < uVar10) {
                lVar13 = 0;
                pfVar19 = local_48;
                do {
                  fVar1 = *(float *)((long)local_38 + lVar13 * 8 + (long)*lda * (long)pfVar16 + -4);
                  fVar2 = *(float *)((long)local_38 + lVar13 * 8 + (long)*lda * (long)pfVar16);
                  local_98.r = fVar1 * ((singlecomplex *)(pfVar19 + -1))->r - *pfVar19 * fVar2;
                  local_98.i = fVar1 * *pfVar19 + ((singlecomplex *)(pfVar19 + -1))->r * fVar2;
                  local_a8.r = local_a8.r - local_98.r;
                  local_a8.i = local_a8.i - local_98.i;
                  pfVar19 = pfVar19 + (long)*incx * 2;
                  lVar13 = lVar13 + 1;
                  local_a0.r = local_a8.r;
                  local_a0.i = local_a8.i;
                } while (lVar23 != lVar13);
              }
              if (cVar6 == 'N') {
                psVar14 = a + (int)lVar18 * (*lda + 1);
LAB_0011b940:
                c_div(&local_a0,&local_a8,psVar14);
                local_a8.r = local_a0.r;
                local_a8.i = local_a0.i;
                a = local_80;
                lda = local_78;
                n = (integer *)local_68;
              }
            }
            else {
              local_60 = pfVar16;
              local_50 = lVar21;
              local_40 = lVar18;
              if (1 < uVar10) {
                lVar18 = 0;
                iVar15 = (int)local_90;
                do {
                  r_cnjg(&local_70,a + (long)*lda * (long)(int)lVar23 + lVar18);
                  local_98.r = local_70.r * x[(long)iVar15 + -1].r -
                               x[(long)iVar15 + -1].i * local_70.i;
                  local_98.i = local_70.r * x[(long)iVar15 + -1].i +
                               x[(long)iVar15 + -1].r * local_70.i;
                  local_a0.r = local_a8.r - local_98.r;
                  local_a0.i = local_a8.i - local_98.i;
                  iVar15 = iVar15 + *incx;
                  lVar18 = lVar18 + 1;
                  a = local_80;
                  lda = local_78;
                  local_a8.r = local_a0.r;
                  local_a8.i = local_a0.i;
                } while (lVar23 != lVar18);
              }
              lVar21 = local_50;
              pfVar16 = local_60;
              n = (integer *)local_68;
              if (cVar6 == 'N') {
                psVar14 = &local_98;
                r_cnjg(psVar14,a + (int)local_40 * (*lda + 1));
                goto LAB_0011b940;
              }
            }
            x[lVar21 + -1].r = local_a8.r;
            x[lVar21 + -1].i = local_a8.i;
            iVar17 = *incx + (int)lVar21;
            lVar23 = lVar23 + 1;
            pfVar16 = (float *)((long)pfVar16 + 8);
            bVar9 = (long)uVar10 < (long)*n;
            uVar10 = uVar10 + 1;
          } while (bVar9);
        }
      }
      else if (iVar15 == 1) {
        if (0 < (int)uVar7) {
          local_90 = &a[-1].i;
          lVar23 = uVar10 * 8;
          do {
            lVar23 = lVar23 + -8;
            uVar12 = uVar10 - 1;
            local_a8.r = x[uVar10 - 1].r;
            local_a8.i = x[uVar10 - 1].i;
            lVar18 = (long)*n;
            if ((char)local_58 == 'T') {
              if ((long)uVar10 < lVar18) {
                do {
                  fVar1 = *(float *)((long)local_90 + lVar18 * 8 + *lda * lVar23 + -4);
                  fVar2 = *(float *)((long)local_90 + lVar18 * 8 + *lda * lVar23);
                  lVar21 = lVar18 + -1;
                  lVar13 = lVar18 + -1;
                  lVar18 = lVar18 + -1;
                  local_98.r = fVar1 * x[lVar21].r - x[lVar13].i * fVar2;
                  local_98.i = x[lVar13].i * fVar1 + x[lVar21].r * fVar2;
                  local_a8.r = local_a8.r - local_98.r;
                  local_a8.i = local_a8.i - local_98.i;
                  local_a0.r = local_a8.r;
                  local_a0.i = local_a8.i;
                } while ((long)uVar10 < lVar18);
              }
              if (cVar6 == 'N') {
                psVar14 = a + (int)uVar12 * (*lda + 1);
LAB_0011b541:
                c_div(&local_a0,&local_a8,psVar14);
                local_a8.r = local_a0.r;
                local_a8.i = local_a0.i;
                a = local_80;
                lda = local_78;
                n = (integer *)local_68;
              }
            }
            else {
              local_60 = (float *)CONCAT44(local_60._4_4_,iVar20);
              if ((long)uVar10 < lVar18) {
                uVar22 = (long)(*n + -1);
                do {
                  r_cnjg(&local_70,a + (long)*lda * (long)iVar20 + uVar22);
                  local_98.r = local_70.r * x[uVar22 & 0xffffffff].r -
                               x[uVar22 & 0xffffffff].i * local_70.i;
                  local_98.i = local_70.r * x[uVar22 & 0xffffffff].i +
                               x[uVar22 & 0xffffffff].r * local_70.i;
                  local_a0.r = local_a8.r - local_98.r;
                  local_a0.i = local_a8.i - local_98.i;
                  bVar9 = (long)uVar10 < (long)uVar22;
                  a = local_80;
                  lda = local_78;
                  uVar22 = uVar22 - 1;
                  local_a8.r = local_a0.r;
                  local_a8.i = local_a0.i;
                } while (bVar9);
              }
              iVar20 = (int)local_60;
              n = (integer *)local_68;
              if (cVar6 == 'N') {
                psVar14 = &local_98;
                r_cnjg(psVar14,a + (int)uVar12 * (*lda + 1));
                goto LAB_0011b541;
              }
            }
            x[uVar12].r = local_a8.r;
            x[uVar12].i = local_a8.i;
            iVar20 = iVar20 + -1;
            bVar9 = 1 < (long)uVar10;
            uVar10 = uVar12;
          } while (bVar9);
        }
      }
      else if (0 < (int)uVar7) {
        iVar17 = iVar17 + iVar15 * (uVar7 - 1);
        local_48 = &a[-1].i;
        lVar23 = uVar10 * 8;
        local_90 = (float *)CONCAT44(local_90._4_4_,iVar17);
        do {
          lVar23 = lVar23 + -8;
          lVar21 = (long)iVar17;
          local_a8.r = x[lVar21 + -1].r;
          local_a8.i = x[lVar21 + -1].i;
          lVar18 = (long)*n;
          if ((char)local_58 == 'T') {
            if ((long)uVar10 < lVar18) {
              iVar15 = (int)local_90;
              do {
                fVar1 = *(float *)((long)local_48 + lVar18 * 8 + *lda * lVar23 + -4);
                fVar2 = *(float *)((long)local_48 + lVar18 * 8 + *lda * lVar23);
                lVar18 = lVar18 + -1;
                local_98.r = fVar1 * x[(long)iVar15 + -1].r - x[(long)iVar15 + -1].i * fVar2;
                local_98.i = x[(long)iVar15 + -1].i * fVar1 + x[(long)iVar15 + -1].r * fVar2;
                local_a8.r = local_a8.r - local_98.r;
                local_a8.i = local_a8.i - local_98.i;
                iVar15 = iVar15 - *incx;
                local_a0.r = local_a8.r;
                local_a0.i = local_a8.i;
              } while ((long)uVar10 < lVar18);
            }
            if (cVar6 == 'N') {
              psVar14 = a + ((int)uVar10 + -1) * (*lda + 1);
LAB_0011bd8f:
              c_div(&local_a0,&local_a8,psVar14);
              local_a8.r = local_a0.r;
              local_a8.i = local_a0.i;
              a = local_80;
              lda = local_78;
              n = (integer *)local_68;
            }
          }
          else {
            local_60 = (float *)CONCAT44(local_60._4_4_,iVar20);
            local_50 = lVar21;
            local_40 = lVar23;
            if ((long)uVar10 < lVar18) {
              lVar23 = (long)(*n + -1);
              iVar15 = (int)local_90;
              do {
                r_cnjg(&local_70,a + (long)*lda * (long)iVar20 + lVar23);
                local_98.r = local_70.r * x[(long)iVar15 + -1].r -
                             x[(long)iVar15 + -1].i * local_70.i;
                local_98.i = local_70.r * x[(long)iVar15 + -1].i +
                             x[(long)iVar15 + -1].r * local_70.i;
                local_a0.r = local_a8.r - local_98.r;
                local_a0.i = local_a8.i - local_98.i;
                iVar15 = iVar15 - *incx;
                bVar9 = (long)uVar10 < lVar23;
                a = local_80;
                lda = local_78;
                lVar23 = lVar23 + -1;
                local_a8.r = local_a0.r;
                local_a8.i = local_a0.i;
              } while (bVar9);
            }
            lVar23 = local_40;
            iVar20 = (int)local_60;
            lVar21 = local_50;
            n = (integer *)local_68;
            if (cVar6 == 'N') {
              psVar14 = &local_98;
              r_cnjg(psVar14,a + ((int)uVar10 + -1) * (*lda + 1));
              lVar21 = local_50;
              goto LAB_0011bd8f;
            }
          }
          x[lVar21 + -1].r = local_a8.r;
          x[lVar21 + -1].i = local_a8.i;
          iVar17 = (int)lVar21 - *incx;
          iVar20 = iVar20 + -1;
          bVar9 = 1 < (long)uVar10;
          uVar10 = uVar10 - 1;
        } while (bVar9);
      }
    }
  }
  else {
    input_error("CTRSV ",&local_84);
  }
  return;
}

Assistant:

void ctrsv_(char *uplo, char *trans, char *diag, integer *n, 
	singlecomplex *a, integer *lda, singlecomplex *x, integer *incx)
{


    /* System generated locals */

    singlecomplex q__1, q__2, q__3;

    /* Builtin functions */
    void c_div(singlecomplex *, singlecomplex *, singlecomplex *), r_cnjg(singlecomplex *, singlecomplex *);

    /* Local variables */
    integer info;
    singlecomplex temp;
    integer i, j;
    integer ix, jx, kx;
    logical noconj, nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    CTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   or   conjg( A' )*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   conjg( A' )*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - COMPLEX          array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - COMPLEX          array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("CTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    noconj = (strncmp(trans, "T", 1)==0);
    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j).r != 0.f || X(j).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(j), &A(j,j));
			    X(j).r = q__1.r, X(j).i = q__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j - 1; i >= 1; --i) {
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(i).r - q__2.r, q__1.i = X(i).i - 
				    q__2.i;
			    X(i).r = q__1.r, X(i).i = q__1.i;
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx).r != 0.f || X(jx).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(jx), &A(j,j));
			    X(jx).r = q__1.r, X(jx).i = q__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(ix).r - q__2.r, q__1.i = X(ix).i - 
				    q__2.i;
			    X(ix).r = q__1.r, X(ix).i = q__1.i;
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j).r != 0.f || X(j).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(j), &A(j,j));
			    X(j).r = q__1.r, X(j).i = q__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j + 1; i <= *n; ++i) {
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(i).r - q__2.r, q__1.i = X(i).i - 
				    q__2.i;
			    X(i).r = q__1.r, X(i).i = q__1.i;
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx).r != 0.f || X(jx).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(jx), &A(j,j));
			    X(jx).r = q__1.r, X(jx).i = q__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(ix).r - q__2.r, q__1.i = X(ix).i - 
				    q__2.i;
			    X(ix).r = q__1.r, X(ix).i = q__1.i;
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x  or  x := inv( conjg( A' ) )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    q__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, q__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L90: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(i).r - q__3.i * X(i).i, 
				    q__2.i = q__3.r * X(i).i + q__3.i * X(
				    i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L100: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L110: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    q__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, q__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix += *incx;
/* L120: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(ix).r - q__3.i * X(ix).i, 
				    q__2.i = q__3.r * X(ix).i + q__3.i * X(
				    ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix += *incx;
/* L130: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx += *incx;
/* L140: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    q__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, q__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L150: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(i).r - q__3.i * X(i).i, 
				    q__2.i = q__3.r * X(i).i + q__3.i * X(
				    i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L160: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L170: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    q__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, q__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix -= *incx;
/* L180: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(ix).r - q__3.i * X(ix).i, 
				    q__2.i = q__3.r * X(ix).i + q__3.i * X(
				    ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix -= *incx;
/* L190: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx -= *incx;
/* L200: */
		}
	    }
	}
    }

    return;

/*     End of CTRSV . */

}